

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_Bob(player_t *player,DAngle *angle,double move,bool forward)

{
  APlayerPawn *pAVar1;
  undefined3 in_register_00000011;
  double dVar2;
  TAngle<double> local_28;
  double dStack_20;
  
  if (((CONCAT31(in_register_00000011,forward) != 0) &&
      ((pAVar1 = player->mo, (pAVar1->super_AActor).waterlevel != 0 ||
       (((pAVar1->super_AActor).flags.Value & 0x200) != 0)))) &&
     ((dVar2 = (pAVar1->super_AActor).Angles.Pitch.Degrees, dVar2 != 0.0 || (NAN(dVar2))))) {
    dVar2 = TAngle<double>::Cos(&(pAVar1->super_AActor).Angles.Pitch);
    move = move * dVar2;
  }
  TAngle<double>::ToVector(&local_28,move);
  (player->Vel).X = (player->Vel).X + local_28.Degrees;
  (player->Vel).Y = (player->Vel).Y + dStack_20;
  return;
}

Assistant:

void P_Bob (player_t *player, DAngle angle, double move, bool forward)
{
	if (forward
		&& (player->mo->waterlevel || (player->mo->flags & MF_NOGRAVITY))
		&& player->mo->Angles.Pitch != 0)
	{
		move *= player->mo->Angles.Pitch.Cos();
	}
	player->Vel += angle.ToVector(move);
}